

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::adjust_panning(Renderer *this,int chan)

{
  Voice *v_00;
  int iVar1;
  double local_38;
  double pan;
  Voice *v;
  int i;
  Channel *chanp;
  int chan_local;
  Renderer *this_local;
  
  v._4_4_ = this->voices;
  while (iVar1 = v._4_4_ + -1, v._4_4_ != 0) {
    v_00 = this->voice + iVar1;
    v._4_4_ = iVar1;
    if (((uint)v_00->channel == chan) && ((v_00->status & 1) != 0)) {
      local_38 = (double)(int)this->channel[chan].panning / 128.0;
      if (v_00->sample->type == '\x02') {
        local_38 = (double)(int)v_00->sample->panning / 500.0 + local_38;
      }
      compute_pan(local_38,(uint)v_00->sample->type,&v_00->left_offset,&v_00->right_offset);
      apply_envelope_to_amp(v_00);
    }
  }
  return;
}

Assistant:

void Renderer::adjust_panning(int chan)
{
	Channel *chanp = &channel[chan];
	int i = voices;
	while (i--)
	{
		Voice *v = &voice[i];
		if ((v->channel == chan) && (v->status & VOICE_RUNNING))
		{
			double pan = chanp->panning / 128.0;
			if (v->sample->type == INST_SF2)
			{ // Add instrument pan to channel pan.
				pan += v->sample->panning / 500.0;
			}
			compute_pan(pan, v->sample->type, v->left_offset, v->right_offset);
			apply_envelope_to_amp(v);
		}
	}
}